

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall pegmatite::Context::restore(Context *this,ParsingState *st)

{
  pointer pPVar1;
  undefined8 *puVar2;
  pointer pPVar3;
  pointer pPVar4;
  Index IVar5;
  Rule *pRVar6;
  Input *pIVar7;
  undefined8 uVar8;
  Index IVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  *this_00;
  pointer pPVar13;
  ParseMatch *pPVar14;
  allocator<(anonymous_namespace)::ParseMatch> *extraout_RDX;
  ulong uVar15;
  long lVar16;
  ParseMatch *pPVar17;
  ulong __n;
  
  iVar10 = (st->position).col;
  (this->position).line = (st->position).line;
  (this->position).col = iVar10;
  IVar5 = (st->position).it.idx;
  (this->position).it.buffer = (st->position).it.buffer;
  (this->position).it.idx = IVar5;
  uVar15 = st->matches;
  pPVar3 = (this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar17 = (this->matches).
            super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pPVar17 - (long)pPVar3;
  uVar11 = lVar16 / 0x38;
  __n = uVar15 - uVar11;
  if (uVar15 < uVar11 || __n == 0) {
    if ((uVar15 < uVar11) && (pPVar14 = pPVar3 + uVar15, pPVar17 != pPVar14)) {
      (this->matches).
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPVar14;
    }
  }
  else {
    lVar12 = (long)(this->matches).
                   super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar17;
    if ((ulong)(lVar12 / 0x38) < __n) {
      uVar15 = __n;
      this_00 = (_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 *)std::
                   vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                   ::_M_check_len(&this->matches,__n,"vector::_M_default_append");
      pPVar13 = std::
                _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                ::_M_allocate(this_00,uVar15);
      pPVar17 = (ParseMatch *)(lVar16 + (long)pPVar13);
      std::
      __uninitialized_default_n_a<(anonymous_namespace)::ParseMatch*,unsigned_long,(anonymous_namespace)::ParseMatch>
                (pPVar17,__n,extraout_RDX);
      pPVar3 = (this->matches).
               super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar4 = (this->matches).
               super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (lVar16 = 0;
          pPVar1 = (pointer)((long)&(((_Vector_impl *)&pPVar3->matched_rule)->
                                    super__Vector_impl_data)._M_start + lVar16), pPVar1 != pPVar4;
          lVar16 = lVar16 + 0x38) {
        puVar2 = (undefined8 *)((long)&pPVar13->matched_rule + lVar16);
        puVar2[6] = *(undefined8 *)&(pPVar1->source).finish.line;
        pRVar6 = pPVar1->matched_rule;
        pIVar7 = (pPVar1->source).start.it.buffer;
        IVar5 = (pPVar1->source).start.it.idx;
        uVar8 = *(undefined8 *)&(pPVar1->source).start.line;
        IVar9 = (pPVar1->source).finish.it.idx;
        puVar2[4] = (pPVar1->source).finish.it.buffer;
        puVar2[5] = IVar9;
        puVar2[2] = IVar5;
        puVar2[3] = uVar8;
        *puVar2 = pRVar6;
        puVar2[1] = pIVar7;
      }
      lVar16 = (long)(this->matches).
                     super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar3;
      std::
      _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ::_M_deallocate((_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                       *)pPVar3,(pointer)(lVar16 / 0x38),lVar16 % 0x38);
      (this->matches).
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_start = pPVar13;
      (this->matches).
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPVar17 + __n;
      (this->matches).
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar13 + (long)this_00;
    }
    else {
      pPVar17 = std::
                __uninitialized_default_n_a<(anonymous_namespace)::ParseMatch*,unsigned_long,(anonymous_namespace)::ParseMatch>
                          (pPVar17,__n,
                           (allocator<(anonymous_namespace)::ParseMatch> *)(lVar12 % 0x38));
      (this->matches).
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPVar17;
    }
  }
  return;
}

Assistant:

void restore(const ParsingState &st)
	{
		position = st.position;
		matches.resize(st.matches);
	}